

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O1

Fad<double> * __thiscall
Fad<double>::operator=
          (Fad<double> *this,
          FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
          *fadexpr)

{
  double dVar1;
  uint uVar2;
  FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
  *pFVar3;
  FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_> *pFVar4;
  FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_> *pFVar5;
  bool bVar6;
  uint uVar7;
  double *pdVar8;
  uint uVar9;
  ulong uVar10;
  value_type vVar11;
  double dVar12;
  double dVar13;
  
  pFVar3 = (fadexpr->fadexpr_).left_;
  pFVar4 = (fadexpr->fadexpr_).right_;
  pFVar5 = (pFVar3->fadexpr_).right_;
  uVar2 = (((pFVar5->fadexpr_).expr_.fadexpr_.left_)->dx_).num_elts;
  uVar7 = (((pFVar5->fadexpr_).expr_.fadexpr_.right_)->dx_).num_elts;
  if ((int)uVar7 < (int)uVar2) {
    uVar7 = uVar2;
  }
  uVar2 = (((pFVar3->fadexpr_).left_)->dx_).num_elts;
  if ((int)uVar7 < (int)uVar2) {
    uVar7 = uVar2;
  }
  uVar2 = (((pFVar4->fadexpr_).expr_.fadexpr_.left_)->dx_).num_elts;
  uVar9 = (((pFVar4->fadexpr_).expr_.fadexpr_.right_)->dx_).num_elts;
  if ((int)uVar9 < (int)uVar2) {
    uVar9 = uVar2;
  }
  if ((int)uVar9 < (int)uVar7) {
    uVar9 = uVar7;
  }
  uVar2 = (this->dx_).num_elts;
  if (uVar9 != uVar2) {
    if (uVar9 == 0) {
      if (uVar2 != 0) {
        pdVar8 = (this->dx_).ptr_to_data;
        if (pdVar8 != (double *)0x0) {
          operator_delete__(pdVar8);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
    }
    else {
      if (uVar2 != 0) {
        pdVar8 = (this->dx_).ptr_to_data;
        if (pdVar8 != (double *)0x0) {
          operator_delete__(pdVar8);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
      (this->dx_).num_elts = uVar9;
      uVar10 = 0xffffffffffffffff;
      if (-1 < (int)uVar9) {
        uVar10 = (long)(int)uVar9 << 3;
      }
      pdVar8 = (double *)operator_new__(uVar10);
      (this->dx_).ptr_to_data = pdVar8;
    }
  }
  if (uVar9 != 0) {
    pdVar8 = (this->dx_).ptr_to_data;
    bVar6 = FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>
            ::hasFastAccess(&fadexpr->fadexpr_);
    if (bVar6) {
      if (0 < (int)uVar9) {
        uVar10 = 0;
        do {
          vVar11 = FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>
                   ::fastAccessDx(&fadexpr->fadexpr_,(int)uVar10);
          pdVar8[uVar10] = vVar11;
          uVar10 = uVar10 + 1;
        } while (uVar9 != uVar10);
      }
    }
    else if (0 < (int)uVar9) {
      uVar10 = 0;
      do {
        vVar11 = FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>
                 ::dx(&fadexpr->fadexpr_,(int)uVar10);
        pdVar8[uVar10] = vVar11;
        uVar10 = uVar10 + 1;
      } while (uVar9 != uVar10);
    }
  }
  pFVar3 = (fadexpr->fadexpr_).left_;
  pFVar5 = (pFVar3->fadexpr_).right_;
  dVar1 = ((pFVar3->fadexpr_).left_)->val_;
  dVar12 = sin(((pFVar5->fadexpr_).expr_.fadexpr_.left_)->val_ *
               ((pFVar5->fadexpr_).expr_.fadexpr_.right_)->val_);
  pFVar4 = (fadexpr->fadexpr_).right_;
  dVar13 = cos(((pFVar4->fadexpr_).expr_.fadexpr_.left_)->val_ *
               ((pFVar4->fadexpr_).expr_.fadexpr_.right_)->val_);
  this->val_ = dVar13 * dVar12 * dVar1;
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}